

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImVec2 p_min;
  ImVec2 p_min_00;
  ImVec2 p_min_01;
  ImVec2 p_min_02;
  ImVec2 IVar1;
  bool bVar2;
  uint uVar3;
  float fVar4;
  ImVec2 *in_RCX;
  ImGuiWindowTempData *min;
  char *in_RDX;
  uint in_ESI;
  ImGuiID in_EDI;
  float fVar5;
  ImVec2 IVar6;
  char log_suffix [3];
  char log_prefix [4];
  ImVec2 text_pos;
  ImU32 col;
  bool toggled;
  bool pressed;
  bool held;
  bool hovered;
  ImGuiButtonFlags button_flags;
  bool item_add;
  bool is_leaf;
  bool is_open;
  ImRect interact_bb;
  float text_width;
  float text_offset_x;
  ImRect frame_bb;
  float frame_height;
  float text_base_offset_y;
  ImVec2 label_size;
  ImVec2 padding;
  bool display_frame;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe40;
  float in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe48;
  ImRect *in_stack_fffffffffffffe50;
  ImRect *in_stack_fffffffffffffe58;
  ImVec2 *in_stack_fffffffffffffe60;
  ImRect *in_stack_fffffffffffffe68;
  ImVec2 *pIVar7;
  ImVec2 *in_stack_fffffffffffffe70;
  ImVec2 *text_size_if_known;
  ImRect *in_stack_fffffffffffffe78;
  undefined1 hide_text_after_hash;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  ImRect *pos_max;
  ImVec2 in_stack_fffffffffffffe90;
  ImVec2 *pIVar8;
  float rounding;
  undefined4 in_stack_fffffffffffffea0;
  ImU32 fill_col;
  ImVec2 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeb0;
  byte in_stack_fffffffffffffeb2;
  undefined1 in_stack_fffffffffffffeb3;
  float local_144;
  ImVec2 local_128;
  ImVec2 local_120;
  ImGuiNavHighlightFlags in_stack_fffffffffffffee8;
  ImGuiID in_stack_fffffffffffffeec;
  ImRect *in_stack_fffffffffffffef0;
  ImVec2 local_f8;
  ImVec2 local_f0;
  undefined2 local_e7;
  undefined1 local_e5;
  undefined4 local_e4;
  ImVec2 local_e0;
  ImVec2 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  float in_stack_ffffffffffffff48;
  float dir;
  float fVar9;
  ImVec2 local_a8;
  bool local_a0;
  undefined1 local_9f;
  byte local_9e;
  byte local_9d;
  uint local_9c;
  undefined1 local_97;
  byte local_96;
  byte local_95;
  undefined8 local_94;
  undefined8 local_8c;
  ImVec2 local_84;
  float local_7c;
  float local_78;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImRect local_64;
  float local_54;
  float local_50;
  ImVec2 local_4c;
  ImVec2 local_44;
  byte local_39;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  ImVec2 *local_20;
  char *local_18;
  uint local_c;
  ImGuiID local_8;
  bool local_1;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_39 = (local_c & 2) != 0;
    if (((bool)local_39) || ((local_c & 0x400) != 0)) {
      local_44 = (GImGui->Style).FramePadding;
    }
    else {
      ImVec2::ImVec2(&local_44,(GImGui->Style).FramePadding.x,0.0);
    }
    if (local_20 == (ImVec2 *)0x0) {
      local_20 = (ImVec2 *)FindRenderedTextEnd(local_18,(char *)0x0);
    }
    local_4c = CalcTextSize((char *)in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                            SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe58,0));
    local_50 = ImMax<float>(local_44.y,(local_28->DC).CurrentLineTextBaseOffset);
    fVar5 = (local_38->FramePadding).y;
    fVar5 = ImMin<float>((local_28->DC).CurrentLineSize.y,fVar5 + fVar5 + local_30->FontSize);
    local_54 = ImMax<float>(fVar5,local_44.y + local_44.y + local_4c.y);
    min = &local_28->DC;
    fVar5 = (local_28->Pos).x;
    local_74 = GetContentRegionMax();
    ImVec2::ImVec2(&local_6c,fVar5 + local_74.x,(local_28->DC).CursorPos.y + local_54);
    ImRect::ImRect(&local_64,&min->CursorPos,&local_6c);
    if ((local_39 & 1) != 0) {
      local_64.Min.x = local_64.Min.x - ((float)(int)((local_28->WindowPadding).x * 0.5) - 1.0);
      local_64.Max.x = ((float)(int)((local_28->WindowPadding).x * 0.5) - 1.0) + local_64.Max.x;
    }
    if ((local_39 & 1) == 0) {
      local_144 = local_44.x * 2.0;
    }
    else {
      local_144 = local_44.x * 3.0;
    }
    local_78 = local_30->FontSize + local_144;
    if (local_4c.x <= 0.0) {
      fVar5 = 0.0;
    }
    else {
      fVar5 = local_44.x + local_44.x + local_4c.x;
    }
    local_7c = local_30->FontSize + fVar5;
    ImVec2::ImVec2(&local_84,local_7c,local_54);
    ItemSize(in_stack_fffffffffffffe60,(float)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    if ((local_39 & 1) == 0) {
      ImRect::ImRect(in_stack_fffffffffffffe50,(float)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (float)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                     in_stack_fffffffffffffe40);
    }
    else {
      local_94 = CONCAT44(local_64.Min.y,local_64.Min.x);
      local_8c = CONCAT44(local_64.Max.y,local_64.Max.x);
    }
    local_95 = TreeNodeBehaviorIsOpen
                         ((ImGuiID)in_stack_fffffffffffffe60,
                          (ImGuiTreeNodeFlags)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    local_96 = (local_c & 0x100) != 0;
    if (((((bool)local_95) && ((local_30->NavIdIsAlive & 1U) == 0)) && ((local_c & 0x2000) != 0)) &&
       ((local_c & 8) == 0)) {
      (local_28->DC).TreeDepthMayJumpToParentOnPop =
           1 << ((byte)(local_28->DC).TreeDepth & 0x1f) |
           (local_28->DC).TreeDepthMayJumpToParentOnPop;
    }
    local_97 = ItemAdd(in_stack_fffffffffffffe68,(ImGuiID)((ulong)in_stack_fffffffffffffe60 >> 0x20)
                       ,in_stack_fffffffffffffe58);
    (local_28->DC).LastItemStatusFlags = (local_28->DC).LastItemStatusFlags | 2;
    IVar6.y = local_64.Min.y;
    IVar6.x = local_64.Min.x;
    (local_28->DC).LastItemDisplayRect.Min = IVar6;
    IVar1.y = local_64.Max.y;
    IVar1.x = local_64.Max.x;
    (local_28->DC).LastItemDisplayRect.Max = IVar1;
    if ((bool)local_97) {
      uVar3 = 0;
      if ((local_c & 4) != 0) {
        uVar3 = 0x40;
      }
      local_9c = uVar3 | 0x400;
      if ((local_96 & 1) == 0) {
        local_9c = uVar3 | 0x1400;
      }
      if ((local_c & 0x40) != 0) {
        uVar3 = 0;
        if ((local_c & 0x80) != 0) {
          uVar3 = 2;
        }
        local_9c = uVar3 | 0x10 | local_9c;
      }
      local_9f = ButtonBehavior(in_stack_fffffffffffffe78,
                                (ImGuiID)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                (bool *)in_stack_fffffffffffffe68,(bool *)in_stack_fffffffffffffe60,
                                (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      if ((local_96 & 1) == 0) {
        local_a0 = false;
        if ((bool)local_9f) {
          in_stack_fffffffffffffeb3 = true;
          if ((local_c & 0xc0) != 0) {
            in_stack_fffffffffffffeb3 = local_30->NavActivateId == local_8;
          }
          local_a0 = (bool)in_stack_fffffffffffffeb3;
          if ((local_c & 0x80) != 0) {
            in_stack_fffffffffffffea8 = (ImVec2)&local_94;
            ImVec2::ImVec2(&local_a8,(float)local_94 + local_78,local_8c._4_4_);
            bVar2 = IsMouseHoveringRect(&in_stack_fffffffffffffe78->Min,in_stack_fffffffffffffe70,
                                        SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0));
            in_stack_fffffffffffffeb2 = 0;
            if (bVar2) {
              in_stack_fffffffffffffeb2 = local_30->NavDisableMouseHover ^ 0xff;
            }
            local_a0 = (local_a0 & 1U) != 0 || (in_stack_fffffffffffffeb2 & 1) != 0;
          }
          if ((local_c & 0x40) != 0) {
            local_a0 = local_a0 != false || ((local_30->IO).MouseDoubleClicked[0] & 1U) != 0;
          }
          if (((local_30->DragDropActive & 1U) != 0) && ((local_95 & 1) != 0)) {
            local_a0 = false;
          }
        }
        if (((local_30->NavId == local_8) && ((local_30->NavMoveRequest & 1U) != 0)) &&
           ((local_30->NavMoveDir == 0 && ((local_95 & 1) != 0)))) {
          local_a0 = true;
          NavMoveRequestCancel();
        }
        if ((((local_30->NavId == local_8) && ((local_30->NavMoveRequest & 1U) != 0)) &&
            (local_30->NavMoveDir == 1)) && ((local_95 & 1) == 0)) {
          local_a0 = true;
          NavMoveRequestCancel();
        }
        if ((local_a0 & 1U) != 0) {
          local_95 = (local_95 ^ 0xff) & 1;
          ImGuiStorage::SetInt
                    ((ImGuiStorage *)in_stack_fffffffffffffe70,
                     (ImGuiID)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (int)in_stack_fffffffffffffe68);
        }
      }
      if ((local_c & 4) != 0) {
        SetItemAllowOverlap();
      }
      if (((local_9e & 1) == 0) || ((local_9d & 1) == 0)) {
        fill_col = 0x18;
        if ((local_9d & 1) != 0) {
          fill_col = 0x19;
        }
      }
      else {
        fill_col = 0x1a;
      }
      fVar4 = (float)GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                 SUB84(in_stack_fffffffffffffe50,0));
      pIVar8 = (ImVec2 *)&stack0xffffffffffffff44;
      ImVec2::ImVec2(pIVar8,local_78,local_50);
      rounding = (float)((ulong)pIVar8 >> 0x20);
      IVar6 = operator+(in_stack_fffffffffffffe38,(ImVec2 *)0x1751a7);
      dir = IVar6.x;
      fVar9 = IVar6.y;
      bVar2 = SUB41((uint)in_stack_fffffffffffffea0 >> 0x18,0);
      if ((local_39 & 1) == 0) {
        if (((local_9d & 1) != 0) || ((local_c & 1) != 0)) {
          p_min_00.x._2_1_ = in_stack_fffffffffffffeb2;
          p_min_00.x._0_2_ = in_stack_fffffffffffffeb0;
          p_min_00.x._3_1_ = in_stack_fffffffffffffeb3;
          p_min_00.y = fVar5;
          RenderFrame(p_min_00,in_stack_fffffffffffffea8,fill_col,bVar2,rounding);
          RenderNavHighlight(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                             in_stack_fffffffffffffee8);
        }
        hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
        if ((local_c & 0x200) == 0) {
          if ((local_96 & 1) == 0) {
            ImVec2::ImVec2(&local_128,local_44.x,local_30->FontSize * 0.15 + local_50);
            local_120 = operator+(in_stack_fffffffffffffe38,(ImVec2 *)0x175562);
            p_min_02.y = fVar4;
            p_min_02.x = fVar9;
            RenderArrow(p_min_02,(ImGuiDir)dir,in_stack_ffffffffffffff48);
          }
        }
        else {
          IVar6 = (ImVec2)&stack0xfffffffffffffee8;
          ImVec2::ImVec2((ImVec2 *)IVar6,local_78 * 0.5,local_30->FontSize * 0.5 + local_50);
          operator+(in_stack_fffffffffffffe38,(ImVec2 *)0x1754e2);
          RenderBullet(IVar6);
        }
        if ((local_30->LogEnabled & 1U) != 0) {
          LogRenderedText((ImVec2 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
        }
        RenderText(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   (bool)hide_text_after_hash);
      }
      else {
        local_c8 = CONCAT44(local_64.Min.y,local_64.Min.x);
        local_d0 = CONCAT44(local_64.Max.y,local_64.Max.x);
        p_min.x._2_1_ = in_stack_fffffffffffffeb2;
        p_min.x._0_2_ = in_stack_fffffffffffffeb0;
        p_min.x._3_1_ = in_stack_fffffffffffffeb3;
        p_min.y = fVar5;
        RenderFrame(p_min,in_stack_fffffffffffffea8,fill_col,bVar2,rounding);
        pos_max = &local_64;
        RenderNavHighlight(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                           in_stack_fffffffffffffee8);
        pIVar8 = &local_e0;
        ImVec2::ImVec2(pIVar8,local_44.x,local_50);
        local_d8 = operator+(in_stack_fffffffffffffe38,(ImVec2 *)0x17525f);
        p_min_01.y = fVar4;
        p_min_01.x = fVar9;
        RenderArrow(p_min_01,(ImGuiDir)dir,in_stack_ffffffffffffff48);
        if ((local_30->LogEnabled & 1U) == 0) {
          pIVar7 = local_20;
          ImVec2::ImVec2(&local_f8,0.0,0.0);
          RenderTextClipped(pIVar8,&pos_max->Min,in_stack_fffffffffffffe80,
                            (char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,pIVar7,
                            (ImRect *)CONCAT44(fill_col,in_stack_fffffffffffffea0));
        }
        else {
          local_e4 = 0x23230a;
          local_e7 = 0x2323;
          local_e5 = 0;
          LogRenderedText(pIVar8,(char *)pos_max,in_stack_fffffffffffffe80);
          text_size_if_known = &local_64.Max;
          pIVar7 = local_20;
          ImVec2::ImVec2(&local_f0,0.0,0.0);
          RenderTextClipped(pIVar8,&pos_max->Min,(char *)pIVar7,local_18,text_size_if_known,
                            &in_stack_fffffffffffffe68->Min,
                            (ImRect *)CONCAT44(fill_col,in_stack_fffffffffffffea0));
          LogRenderedText(pIVar8,(char *)pos_max,(char *)pIVar7);
        }
      }
      if (((local_95 & 1) != 0) && ((local_c & 8) == 0)) {
        TreePushRawID((ImGuiID)in_stack_fffffffffffffe44);
      }
      local_1 = (bool)(local_95 & 1);
    }
    else {
      if (((local_95 & 1) != 0) && ((local_c & 8) == 0)) {
        TreePushRawID((ImGuiID)in_stack_fffffffffffffe44);
      }
      local_1 = (bool)(local_95 & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = (display_frame || (flags & ImGuiTreeNodeFlags_FramePadding)) ? style.FramePadding : ImVec2(style.FramePadding.x, 0.0f);

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float text_base_offset_y = ImMax(padding.y, window->DC.CurrentLineTextBaseOffset); // Latch before ItemSize changes it
    const float frame_height = ImMax(ImMin(window->DC.CurrentLineSize.y, g.FontSize + style.FramePadding.y*2), label_size.y + padding.y*2);
    ImRect frame_bb = ImRect(window->DC.CursorPos, ImVec2(window->Pos.x + GetContentRegionMax().x, window->DC.CursorPos.y + frame_height));
    if (display_frame)
    {
        // Framed header expand a little outside the default padding
        frame_bb.Min.x -= (float)(int)(window->WindowPadding.x*0.5f) - 1;
        frame_bb.Max.x += (float)(int)(window->WindowPadding.x*0.5f) - 1;
    }

    const float text_offset_x = (g.FontSize + (display_frame ? padding.x*3 : padding.x*2));   // Collapser arrow width + Spacing
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x*2 : 0.0f);   // Include collapser
    ItemSize(ImVec2(text_width, frame_height), text_base_offset_y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    // (Ideally we'd want to add a flag for the user to specify if we want the hit test to be done up to the right side of the content or not)
    const ImRect interact_bb = display_frame ? frame_bb : ImRect(frame_bb.Min.x, frame_bb.Min.y, frame_bb.Min.x + text_width + style.ItemSpacing.x*2, frame_bb.Max.y);
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    bool is_leaf = (flags & ImGuiTreeNodeFlags_Leaf) != 0;

    // Store a flag for the current depth to tell if we will allow closing this node when navigating one of its child.
    // For this purpose we essentially compare if g.NavIdIsAlive went from 0 to 1 between TreeNode() and TreePop().
    // This is currently only support 32 level deep and we are fine with (1 << Depth) overflowing into a zero.
    if (is_open && !g.NavIdIsAlive && (flags & ImGuiTreeNodeFlags_NavLeftJumpsBackHere) && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        window->DC.TreeDepthMayJumpToParentOnPop |= (1 << window->DC.TreeDepth);

    bool item_add = ItemAdd(interact_bb, id);
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDisplayRect;
    window->DC.LastItemDisplayRect = frame_bb;

    if (!item_add)
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushRawID(id);
        IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
        return is_open;
    }

    // Flags that affects opening behavior:
    // - 0(default) ..................... single-click anywhere to open
    // - OpenOnDoubleClick .............. double-click anywhere to open
    // - OpenOnArrow .................... single-click on arrow to open
    // - OpenOnDoubleClick|OpenOnArrow .. single-click on arrow or double-click anywhere to open
    ImGuiButtonFlags button_flags = ImGuiButtonFlags_NoKeyModifiers | ((flags & ImGuiTreeNodeFlags_AllowItemOverlap) ? ImGuiButtonFlags_AllowItemOverlap : 0);
    if (!is_leaf)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnDoubleClick | ((flags & ImGuiTreeNodeFlags_OpenOnArrow) ? ImGuiButtonFlags_PressedOnClickRelease : 0);

    bool hovered, held, pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    if (!is_leaf)
    {
        bool toggled = false;
        if (pressed)
        {
            toggled = !(flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick)) || (g.NavActivateId == id);
            if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
                toggled |= IsMouseHoveringRect(interact_bb.Min, ImVec2(interact_bb.Min.x + text_offset_x, interact_bb.Max.y)) && (!g.NavDisableMouseHover);
            if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
                toggled |= g.IO.MouseDoubleClicked[0];
            if (g.DragDropActive && is_open) // When using Drag and Drop "hold to open" we keep the node highlighted after opening, but never close it again.
                toggled = false;
        }

        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Left && is_open)
        {
            toggled = true;
            NavMoveRequestCancel();
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right && !is_open) // If there's something upcoming on the line we may want to give it the priority?
        {
            toggled = true;
            NavMoveRequestCancel();
        }

        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
    const ImVec2 text_pos = frame_bb.Min + ImVec2(text_offset_x, text_base_offset_y);
    if (display_frame)
    {
        // Framed type
        RenderFrame(frame_bb.Min, frame_bb.Max, col, true, style.FrameRounding);
        RenderNavHighlight(frame_bb, id, ImGuiNavHighlightFlags_TypeThin);
        RenderArrow(frame_bb.Min + ImVec2(padding.x, text_base_offset_y), is_open ? ImGuiDir_Down : ImGuiDir_Right, 1.0f);
        if (g.LogEnabled)
        {
            // NB: '##' is normally used to hide text (as a library-wide feature), so we need to specify the text range to make sure the ## aren't stripped out here.
            const char log_prefix[] = "\n##";
            const char log_suffix[] = "##";
            LogRenderedText(&text_pos, log_prefix, log_prefix+3);
            RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
            LogRenderedText(&text_pos, log_suffix+1, log_suffix+3);
        }
        else
        {
            RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
        }
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || (flags & ImGuiTreeNodeFlags_Selected))
        {
            RenderFrame(frame_bb.Min, frame_bb.Max, col, false);
            RenderNavHighlight(frame_bb, id, ImGuiNavHighlightFlags_TypeThin);
        }

        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(frame_bb.Min + ImVec2(text_offset_x * 0.5f, g.FontSize*0.50f + text_base_offset_y));
        else if (!is_leaf)
            RenderArrow(frame_bb.Min + ImVec2(padding.x, g.FontSize*0.15f + text_base_offset_y), is_open ? ImGuiDir_Down : ImGuiDir_Right, 0.70f);
        if (g.LogEnabled)
            LogRenderedText(&text_pos, ">");
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushRawID(id);
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
    return is_open;
}